

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.cpp
# Opt level: O2

bool __thiscall Game::play(Game *this)

{
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  bool quit;
  bool local_19;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"--= Coloring Game by Uriya Harpeness =--");
  poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"Try to fill the whole board (");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)(this->m_board).m_height);
  poVar3 = std::operator<<(poVar3,"X");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)(this->m_board).m_width);
  poVar3 = std::operator<<(poVar3,") in ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3," moves or less.");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "Controls are: \'r\' - red, \'g\' - green, \'b\' - blue, \'y\' - yellow, \'c\' - cyan, \'m\' - magenta, \'u\' - undo, \'s\' - change base, \'q\' ESC DEL BACKSPACE - quit."
                          );
  std::endl<char,std::char_traits<char>>(poVar3);
  local_19 = false;
  while( true ) {
    bVar2 = local_19;
    bVar1 = Board::solved(&this->m_board);
    if (((bVar1) || (this->m_moves == 0)) || ((bVar2 & 1U) != 0)) break;
    turn(this,&local_19);
  }
  if ((bVar2 & 1U) == 0) {
    Board::print(&this->m_board,this->m_moves);
    bVar2 = Board::solved(&this->m_board);
    poVar3 = (ostream *)&std::cout;
    if (bVar2) {
      poVar3 = std::operator<<((ostream *)&std::cout,"--= Congrats you win =--");
      bVar2 = true;
      goto LAB_00104ed9;
    }
    pcVar4 = "--= Boo you lose =--";
  }
  else {
    poVar3 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    pcVar4 = "--= Rookie move... =--";
  }
  poVar3 = std::operator<<(poVar3,pcVar4);
  bVar2 = false;
LAB_00104ed9:
  std::endl<char,std::char_traits<char>>(poVar3);
  return bVar2;
}

Assistant:

bool Game::play() {
    // Display title.
    cout << "--= Coloring Game by Uriya Harpeness =--" << endl << endl;
    cout << "Try to fill the whole board (" << (int) m_board.get_height() << "X" << (int) m_board.get_width() << ") in "
         << m_moves << " moves or less." << endl;
    cout << "Controls are: 'r' - red, 'g' - green, 'b' - blue, 'y' - yellow, 'c' - cyan, 'm' - magenta, 'u' - undo"
            ", 's' - change base, 'q' ESC DEL BACKSPACE - quit." << endl;

    bool quit = false;
    // Run the game.
    while (!m_board.solved() && (m_moves > 0) && !quit) {
        turn(quit);
    }

    // Disqualification.
    if (quit) {
        cout << endl << "--= Rookie move... =--" << endl;
        return false;
    }

    m_board.print(m_moves);

    if (m_board.solved()) {
        // Victory.
        cout << "--= Congrats you win =--" << endl;
        return true;
    } else {
        // Defeat.
        cout << "--= Boo you lose =--" << endl;
        return false;
    }
}